

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O3

void * qc_list_pophead(QcList *list)

{
  uint *puVar1;
  QcListEntry *pQVar2;
  QcListEntry *pQVar3;
  void *pvVar4;
  
  if (list != (QcList *)0x0) {
    pQVar2 = list->head;
    if (pQVar2 == (QcListEntry *)0x0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pQVar3 = pQVar2->next;
      if (list->cur == pQVar2) {
        list->cur = pQVar3;
      }
      list->head = pQVar3;
      if (pQVar3 != (QcListEntry *)0x0) {
        pQVar3->prev = (QcListEntry *)0x0;
      }
      puVar1 = &list->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        list->tail = (QcListEntry *)0x0;
      }
      pvVar4 = pQVar2->data;
      free(pQVar2);
    }
    return pvVar4;
  }
  qc_list_pophead_cold_1();
  if (list != (QcList *)0x0) {
    if (list->head == (QcListEntry *)0x0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pQVar2 = list->tail;
      if (list->cur == pQVar2) {
        list->cur = (QcListEntry *)0x0;
      }
      if (pQVar2 == list->head) {
        list->head = (QcListEntry *)0x0;
        pQVar3 = pQVar2->prev;
      }
      else {
        pQVar3 = pQVar2->prev;
        pQVar3->next = (QcListEntry *)0x0;
      }
      list->tail = pQVar3;
      list->count = list->count - 1;
      pvVar4 = pQVar2->data;
      free(pQVar2);
    }
    return pvVar4;
  }
  qc_list_poptail_cold_1();
  list->cur = list->head;
  return list->head;
}

Assistant:

void* qc_list_pophead(QcList *list)
{
	QcListEntry	*pop_entry;
	void *pop_data;

    qc_assert(list);

    if(NULL == list->head)
    {
		return NULL;
    }

    pop_entry = list->head;

    if(list->cur == list->head)
    {
        list->cur = list->head->next;
    }

    list->head = list->head->next;
    if(NULL != list->head)
    {
        list->head->prev = NULL;
    }
	
    list->count--;

    if(0 == list->count){
		list->tail = NULL;
	}
    
    pop_data = pop_entry->data;
    qc_free(pop_entry);

    return pop_data;
}